

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

void __thiscall camp::ClassUnrelated::ClassUnrelated(ClassUnrelated *this,ClassUnrelated *param_1)

{
  ClassUnrelated *param_1_local;
  ClassUnrelated *this_local;
  
  Error::Error(&this->super_Error,&param_1->super_Error);
  *(undefined ***)&this->super_Error = &PTR__ClassUnrelated_001fd3e8;
  return;
}

Assistant:

class CAMP_API ClassUnrelated : public Error
{
public:

    /**
     * \brief Constructor
     *
     * \param sourceClass Name of the source class
     * \param requestedClass Name of the requested class
     */
    ClassUnrelated(const std::string& sourceClass, const std::string& requestedClass);
}